

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O0

void anon_unknown.dwarf_99956::addGlyphQuad
               (VertexArray *vertices,Vector2f position,Color *color,Glyph *glyph,float italicShear,
               float outlineThickness)

{
  Vertex *pVVar1;
  long in_RDX;
  Vertex *in_RSI;
  VertexArray *in_RDI;
  undefined8 in_XMM0_Qa;
  float in_XMM1_Da;
  float fVar2;
  float fVar3;
  float in_XMM2_Da;
  float v2;
  float u2;
  float v1;
  float u1;
  float bottom;
  float right;
  float top;
  float left;
  float padding;
  Vertex *vertex;
  Vector2<float> local_124;
  Vector2<float> local_11c;
  Vertex local_114;
  Vector2<float> local_100;
  Vector2<float> local_f8;
  Vertex local_f0;
  Vector2<float> local_dc;
  Vector2<float> local_d4;
  Vertex local_cc;
  Vector2<float> local_b8;
  Vector2<float> local_b0;
  Vertex local_a8;
  Vector2<float> local_94;
  Vector2<float> local_8c;
  Vertex local_84;
  Vector2<float> local_70;
  Vector2<float> local_68;
  Vertex local_60;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  undefined4 local_2c;
  float local_28;
  float local_24;
  Vertex *local_18;
  undefined8 local_8;
  
  local_2c = 0x3f800000;
  local_30 = *(float *)(in_RDX + 4) - 1.0;
  local_34 = *(float *)(in_RDX + 8) - 1.0;
  local_38 = *(float *)(in_RDX + 4) + *(float *)(in_RDX + 0xc) + 1.0;
  local_3c = *(float *)(in_RDX + 8) + *(float *)(in_RDX + 0x10) + 1.0;
  local_40 = (float)*(int *)(in_RDX + 0x14) - 1.0;
  local_44 = (float)*(int *)(in_RDX + 0x18) - 1.0;
  local_48 = (float)(*(int *)(in_RDX + 0x14) + *(int *)(in_RDX + 0x1c)) + 1.0;
  local_4c = (float)(*(int *)(in_RDX + 0x18) + *(int *)(in_RDX + 0x20)) + 1.0;
  local_8._0_4_ = (float)in_XMM0_Qa;
  fVar2 = (float)local_8 + local_30;
  local_8._4_4_ = (float)((ulong)in_XMM0_Qa >> 0x20);
  fVar3 = local_8._4_4_ + local_34;
  local_28 = in_XMM2_Da;
  local_24 = in_XMM1_Da;
  local_18 = in_RSI;
  local_8 = in_XMM0_Qa;
  sf::Vector2<float>::Vector2
            (&local_68,(-in_XMM1_Da * local_34 + fVar2) - in_XMM2_Da,fVar3 - in_XMM2_Da);
  vertex = local_18;
  sf::Vector2<float>::Vector2(&local_70,local_40,local_44);
  sf::Vertex::Vertex(&local_60,&local_68,(Color *)vertex,&local_70);
  sf::VertexArray::append(in_RDI,vertex);
  sf::Vector2<float>::Vector2
            (&local_8c,(-local_24 * local_34 + (float)local_8 + local_38) - local_28,
             (local_8._4_4_ + local_34) - local_28);
  pVVar1 = local_18;
  sf::Vector2<float>::Vector2(&local_94,local_48,local_44);
  sf::Vertex::Vertex(&local_84,&local_8c,(Color *)pVVar1,&local_94);
  sf::VertexArray::append(in_RDI,vertex);
  sf::Vector2<float>::Vector2
            (&local_b0,(-local_24 * local_3c + (float)local_8 + local_30) - local_28,
             (local_8._4_4_ + local_3c) - local_28);
  pVVar1 = local_18;
  sf::Vector2<float>::Vector2(&local_b8,local_40,local_4c);
  sf::Vertex::Vertex(&local_a8,&local_b0,(Color *)pVVar1,&local_b8);
  sf::VertexArray::append(in_RDI,vertex);
  sf::Vector2<float>::Vector2
            (&local_d4,(-local_24 * local_3c + (float)local_8 + local_30) - local_28,
             (local_8._4_4_ + local_3c) - local_28);
  pVVar1 = local_18;
  sf::Vector2<float>::Vector2(&local_dc,local_40,local_4c);
  sf::Vertex::Vertex(&local_cc,&local_d4,(Color *)pVVar1,&local_dc);
  sf::VertexArray::append(in_RDI,vertex);
  sf::Vector2<float>::Vector2
            (&local_f8,(-local_24 * local_34 + (float)local_8 + local_38) - local_28,
             (local_8._4_4_ + local_34) - local_28);
  pVVar1 = local_18;
  sf::Vector2<float>::Vector2(&local_100,local_48,local_44);
  sf::Vertex::Vertex(&local_f0,&local_f8,(Color *)pVVar1,&local_100);
  sf::VertexArray::append(in_RDI,vertex);
  sf::Vector2<float>::Vector2
            (&local_11c,(-local_24 * local_3c + (float)local_8 + local_38) - local_28,
             (local_8._4_4_ + local_3c) - local_28);
  sf::Vector2<float>::Vector2(&local_124,local_48,local_4c);
  sf::Vertex::Vertex(&local_114,&local_11c,(Color *)local_18,&local_124);
  sf::VertexArray::append(in_RDI,vertex);
  return;
}

Assistant:

void addGlyphQuad(sf::VertexArray& vertices, sf::Vector2f position, const sf::Color& color, const sf::Glyph& glyph, float italicShear, float outlineThickness = 0)
    {
        float padding = 1.0;

        float left   = glyph.bounds.left - padding;
        float top    = glyph.bounds.top - padding;
        float right  = glyph.bounds.left + glyph.bounds.width + padding;
        float bottom = glyph.bounds.top  + glyph.bounds.height + padding;

        float u1 = static_cast<float>(glyph.textureRect.left) - padding;
        float v1 = static_cast<float>(glyph.textureRect.top) - padding;
        float u2 = static_cast<float>(glyph.textureRect.left + glyph.textureRect.width) + padding;
        float v2 = static_cast<float>(glyph.textureRect.top  + glyph.textureRect.height) + padding;

        vertices.append(sf::Vertex(sf::Vector2f(position.x + left  - italicShear * top    - outlineThickness, position.y + top    - outlineThickness), color, sf::Vector2f(u1, v1)));
        vertices.append(sf::Vertex(sf::Vector2f(position.x + right - italicShear * top    - outlineThickness, position.y + top    - outlineThickness), color, sf::Vector2f(u2, v1)));
        vertices.append(sf::Vertex(sf::Vector2f(position.x + left  - italicShear * bottom - outlineThickness, position.y + bottom - outlineThickness), color, sf::Vector2f(u1, v2)));
        vertices.append(sf::Vertex(sf::Vector2f(position.x + left  - italicShear * bottom - outlineThickness, position.y + bottom - outlineThickness), color, sf::Vector2f(u1, v2)));
        vertices.append(sf::Vertex(sf::Vector2f(position.x + right - italicShear * top    - outlineThickness, position.y + top    - outlineThickness), color, sf::Vector2f(u2, v1)));
        vertices.append(sf::Vertex(sf::Vector2f(position.x + right - italicShear * bottom - outlineThickness, position.y + bottom - outlineThickness), color, sf::Vector2f(u2, v2)));
    }